

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_bundle_size(char *buffer,uint elm)

{
  uint32_t uVar1;
  int in_ESI;
  long in_RDI;
  bool bVar2;
  size_t last_len;
  size_t elm_pos;
  uint32_t *lengths;
  ulong local_28;
  ulong local_20;
  uint8_t *local_18;
  
  local_18 = (uint8_t *)(in_RDI + 0x10);
  local_20 = 0;
  local_28 = 0;
  while( true ) {
    bVar2 = false;
    if (local_20 != in_ESI + 1) {
      uVar1 = extract_uint32(local_18);
      bVar2 = uVar1 != 0;
    }
    if (!bVar2) break;
    uVar1 = extract_uint32(local_18);
    local_28 = (ulong)uVar1;
    local_20 = local_20 + 1;
    uVar1 = extract_uint32(local_18);
    local_18 = local_18 + (ulong)((uVar1 >> 2) + 1) * 4;
  }
  return local_28;
}

Assistant:

size_t rtosc_bundle_size(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    size_t last_len = 0;
    while(elm_pos!=elm+1 && extract_uint32((const uint8_t*)lengths)) {
        last_len = extract_uint32((const uint8_t*)lengths);
        ++elm_pos, lengths+=extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return last_len;
}